

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo3.cpp
# Opt level: O1

int64_t primecount::pi_lmo3(int64_t x)

{
  int iVar1;
  int iVar2;
  double dVar3;
  undefined1 x_00 [16];
  int *piVar4;
  bool *__s;
  bool bVar5;
  ulong uVar6;
  int64_t iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long res;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long *plVar17;
  long lVar18;
  long lVar19;
  size_t n;
  bool *pbVar20;
  type primes;
  Vector<bool,_std::allocator<bool>_> sieve;
  Vector<long,_std::allocator<long>_> next;
  Vector<int,_std::allocator<int>_> mu;
  Vector<int,_std::allocator<int>_> lpf;
  undefined8 in_stack_fffffffffffffea8;
  double dVar21;
  undefined8 in_stack_fffffffffffffeb0;
  long *plVar22;
  Vector<int,_std::allocator<int>_> local_138;
  long local_120;
  ulong local_118;
  int64_t local_110;
  int *local_108;
  long local_100;
  Vector<bool,_std::allocator<bool>_> local_f8;
  Vector<long,_std::allocator<long>_> local_d8;
  ulong local_c0;
  int64_t local_b8;
  size_t local_b0;
  long local_a8;
  bool *local_a0;
  size_t local_98;
  long local_90;
  long local_88;
  ulong local_80;
  Vector<int,_std::allocator<int>_> local_78;
  Vector<int,_std::allocator<int>_> local_60;
  Vector<long,_std::allocator<long>_> local_48;
  
  if (x < 2) {
    iVar7 = 0;
  }
  else {
    x_00._8_8_ = in_stack_fffffffffffffeb0;
    x_00._0_8_ = in_stack_fffffffffffffea8;
    dVar21 = get_alpha_lmo((primecount *)x,(maxint_t)x_00);
    dVar3 = cbrt((double)x);
    uVar11 = (ulong)dVar3;
    if (0 < (long)uVar11) {
      do {
        if (uVar11 * uVar11 - (ulong)x / uVar11 == 0 ||
            (long)(uVar11 * uVar11) < (long)((ulong)x / uVar11)) goto LAB_0011b03f;
        bVar5 = 1 < (long)uVar11;
        uVar11 = uVar11 - 1;
      } while (bVar5);
      uVar11 = 0;
    }
LAB_0011b03f:
    lVar12 = uVar11 - 1;
    do {
      lVar8 = lVar12 + 2;
      lVar12 = lVar12 + 1;
    } while (lVar8 * lVar8 - x / lVar8 == 0 || lVar8 * lVar8 < x / lVar8);
    uVar11 = (ulong)(dVar21 * (double)lVar12);
    local_118 = 8;
    if (uVar11 < 0x14) {
      local_118 = (ulong)(byte)(&PhiTiny::pi)[uVar11];
    }
    generate_primes_i32(&local_138,uVar11);
    generate_lpf(&local_60,uVar11);
    generate_moebius(&local_78,uVar11);
    lVar12 = (long)local_138.end_ - (long)local_138.array_;
    bVar5 = is_print();
    lVar12 = (lVar12 >> 2) + -1;
    uVar6 = P2(x,uVar11,lVar12,1,bVar5);
    bVar5 = is_print();
    iVar7 = S1(x,uVar11,local_118,1,bVar5);
    lVar8 = x / (long)uVar11;
    dVar21 = (double)lVar8;
    if (dVar21 < 0.0) {
      dVar21 = sqrt(dVar21);
    }
    else {
      dVar21 = SQRT(dVar21);
    }
    n = 0xb504f333;
    if ((long)dVar21 < 0xb504f333) {
      n = (long)dVar21;
    }
    if (lVar8 < (long)(n * n)) {
      do {
        n = n - 1;
      } while (n * n - lVar8 != 0 && lVar8 <= (long)(n * n));
    }
    else {
      lVar9 = n * 2;
      if (lVar9 < (long)(lVar8 - n * n)) {
        do {
          n = n + 1;
          lVar9 = lVar9 + 2;
        } while (lVar9 < (long)(lVar8 - n * n));
      }
    }
    local_f8.array_ = (bool *)0x0;
    local_f8.end_ = (bool *)0x0;
    local_f8.capacity_ = (bool *)0x0;
    Vector<bool,_std::allocator<bool>_>::resize(&local_f8,n);
    local_d8.array_ = (long *)0x0;
    local_d8.end_ = (long *)0x0;
    local_d8.capacity_ = (long *)0x0;
    Vector<long,_std::allocator<long>_>::resize
              (&local_d8,(long)local_138.end_ - (long)local_138.array_ >> 2);
    local_48.array_ = (long *)0x0;
    local_48.end_ = (long *)0x0;
    local_48.capacity_ = (long *)0x0;
    local_b8 = iVar7;
    Vector<long,_std::allocator<long>_>::resize
              (&local_48,(long)local_138.end_ - (long)local_138.array_ >> 2);
    plVar17 = local_48.array_;
    piVar4 = local_138.array_;
    lVar9 = (long)local_138.end_ - (long)local_138.array_ >> 2;
    if (0 < lVar9) {
      lVar9 = lVar9 + 1;
      lVar13 = 0;
      do {
        *(long *)((long)local_d8.array_ + lVar13 * 2) =
             (long)*(int *)((long)local_138.array_ + lVar13);
        lVar9 = lVar9 + -1;
        lVar13 = lVar13 + 4;
      } while (1 < lVar9);
    }
    plVar22 = local_d8.array_;
    if (local_48.array_ != local_48.end_) {
      memset(local_48.array_,0,(long)local_48.end_ - (long)local_48.array_ & 0xfffffffffffffff8);
    }
    __s = local_f8.array_;
    local_c0 = uVar6;
    if (lVar8 < 2) {
      local_120 = 0;
    }
    else {
      local_a0 = local_f8.end_;
      local_b0 = (long)local_f8.end_ - (long)local_f8.array_;
      pbVar20 = local_f8.array_ + -1;
      local_a8 = -n;
      local_120 = 0;
      local_90 = 1;
      local_110 = x;
      local_98 = n;
      local_88 = lVar12;
      local_80 = uVar11;
      do {
        lVar13 = local_90;
        local_90 = lVar13 + local_98;
        lVar9 = local_90;
        if (lVar8 < local_90) {
          lVar9 = lVar8;
        }
        if (__s != local_a0) {
          memset(__s,1,local_b0);
        }
        if (local_118 != 0) {
          uVar11 = 1;
          do {
            lVar14 = plVar22[uVar11];
            if (lVar14 < lVar9) {
              iVar1 = piVar4[uVar11];
              do {
                pbVar20[lVar14] = false;
                lVar14 = lVar14 + iVar1;
              } while (lVar14 < lVar9);
            }
            plVar22[uVar11] = lVar14;
            bVar5 = uVar11 != local_118;
            uVar11 = uVar11 + 1;
          } while (bVar5);
        }
        local_108 = local_78.array_;
        uVar11 = local_118;
        do {
          uVar11 = uVar11 + 1;
          if (lVar12 <= (long)uVar11) break;
          iVar1 = piVar4[uVar11];
          lVar18 = (long)iVar1;
          lVar10 = x / (lVar9 * lVar18);
          lVar14 = (long)local_80 / lVar18;
          if ((long)local_80 / lVar18 < lVar10) {
            lVar14 = lVar10;
          }
          uVar6 = x / (lVar13 * lVar18);
          if ((long)local_80 <= (long)uVar6) {
            uVar6 = local_80;
          }
          if (lVar18 < (long)uVar6) {
            if (lVar14 < (long)uVar6) {
              lVar12 = 0;
              uVar15 = uVar6;
              do {
                iVar2 = local_78.array_[uVar15];
                if (((long)iVar2 != 0) && (iVar1 < local_60.array_[uVar15])) {
                  lVar10 = local_110 / (long)(uVar15 * lVar18) - lVar13;
                  if (lVar12 <= lVar10) {
                    lVar16 = plVar17[uVar11];
                    lVar19 = lVar12;
                    do {
                      lVar16 = lVar16 + (ulong)__s[lVar19];
                      lVar12 = lVar19 + 1;
                      bVar5 = lVar19 < lVar10;
                      lVar19 = lVar12;
                    } while (bVar5);
                    plVar17[uVar11] = lVar16;
                  }
                  local_120 = local_120 - (long)iVar2 * plVar17[uVar11];
                }
                uVar15 = uVar15 - 1;
              } while (lVar14 < (long)uVar15);
            }
            else {
              lVar12 = 0;
            }
            if (lVar12 < lVar9 - lVar13) {
              lVar14 = plVar17[uVar11];
              do {
                lVar14 = lVar14 + (ulong)__s[lVar12];
                lVar12 = lVar12 + 1;
              } while (lVar12 < lVar9 - lVar13);
              plVar17[uVar11] = lVar14;
            }
            lVar12 = plVar22[uVar11];
            if (lVar12 < lVar9) {
              do {
                pbVar20[lVar12] = false;
                lVar12 = lVar12 + lVar18 * 2;
              } while (lVar12 < lVar9);
            }
            plVar22[uVar11] = lVar12;
            x = local_110;
            lVar12 = local_88;
          }
        } while (lVar18 < (long)uVar6);
        pbVar20 = pbVar20 + local_a8;
        local_100 = lVar13;
      } while (local_90 < lVar8);
    }
    operator_delete(plVar17,(long)local_48.capacity_ - (long)plVar17);
    operator_delete(local_d8.array_,(long)local_d8.capacity_ - (long)local_d8.array_);
    operator_delete(local_f8.array_,(long)local_f8.capacity_ - (long)local_f8.array_);
    iVar7 = local_b8 + local_120 + lVar12 + ~local_c0;
    operator_delete(local_78.array_,(long)local_78.capacity_ - (long)local_78.array_);
    operator_delete(local_60.array_,(long)local_60.capacity_ - (long)local_60.array_);
    operator_delete(local_138.array_,(long)local_138.capacity_ - (long)local_138.array_);
  }
  return iVar7;
}

Assistant:

int64_t pi_lmo3(int64_t x)
{
  if (x < 2)
    return 0;

  int threads = 1;
  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t c = PhiTiny::get_c(y);

  auto primes = generate_primes<int32_t>(y);
  auto lpf = generate_lpf(y);
  auto mu = generate_moebius(y);

  int64_t pi_y = primes.size() - 1;
  int64_t p2 = P2(x, y, pi_y, threads);
  int64_t s1 = S1(x, y, c, threads);
  int64_t s2 = S2(x, y, c, pi_y, primes, lpf, mu);
  int64_t phi = s1 + s2;
  int64_t sum = phi + pi_y - 1 - p2;

  return sum;
}